

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

ServiceFlags __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::GetDesirableServiceFlags
          (PeerManagerImpl *this,ServiceFlags services)

{
  long lVar1;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar2;
  ServiceFlags SVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)services >> 10 & 1) != 0) {
    tVar2 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
    SVar3 = NODE_NETWORK_LIMITED|NODE_WITNESS;
    if (((long)tVar2.__d.__r - (this->m_best_block_time)._M_i.__r) /
        (this->m_chainparams->consensus).nPowTargetSpacing < 0x90) goto LAB_001a6ce7;
  }
  SVar3 = NODE_WITNESS|NODE_NETWORK;
LAB_001a6ce7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

ServiceFlags PeerManagerImpl::GetDesirableServiceFlags(ServiceFlags services) const
{
    if (services & NODE_NETWORK_LIMITED) {
        // Limited peers are desirable when we are close to the tip.
        if (ApproximateBestBlockDepth() < NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS) {
            return ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS);
        }
    }
    return ServiceFlags(NODE_NETWORK | NODE_WITNESS);
}